

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Appearance_PDU::SetCapabilitiesFlag(Appearance_PDU *this,KBOOL F)

{
  if ((((this->m_AppearanceFlag1Union).m_ui8Flag & 0x10) == 0) == F) {
    (this->m_AppearanceFlag1Union).m_ui8Flag =
         (this->m_AppearanceFlag1Union).m_ui8Flag & 0xef | F << 4;
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
         ((ushort)F * 8 + (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) - 4;
  }
  return;
}

Assistant:

void Appearance_PDU::SetCapabilitiesFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag1Union.m_ui8Cap )return;

    m_AppearanceFlag1Union.m_ui8Cap = F;

    if( F )
    {
        m_ui16PDULength += EntityCapabilities::ENTITY_CAPABILITIES_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityCapabilities::ENTITY_CAPABILITIES_SIZE;
    }
}